

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O2

void __thiscall
ExprTest_EqualCallExpr_Test::ExprTest_EqualCallExpr_Test(ExprTest_EqualCallExpr_Test *this)

{
  ExprTest::ExprTest(&this->super_ExprTest);
  (this->super_ExprTest).super_Test._vptr_Test = (_func_int **)&PTR__ExprTest_0018fcc8;
  return;
}

Assistant:

TEST_F(ExprTest, EqualCallExpr) {
  Expr args1[] = {MakeVariable(0), MakeVariable(1), MakeConst(42)};
  // args2 is used to make sure that Equal compares expressions structurally
  // instead of comparing pointers; don't replace with args1.
  Expr args2[] = {MakeVariable(0), MakeVariable(1), MakeConst(42)};
  mp::Function f1 = factory_.AddFunction("f1", 0);
  NumericExpr e = MakeCall(f1, args1);
  EXPECT_TRUE(Equal(e, MakeCall(f1, args2)));
  Expr args3[] = {MakeVariable(0), MakeVariable(1)};
  EXPECT_FALSE(Equal(e, MakeCall(f1, args3)));
  EXPECT_FALSE(Equal(MakeCall(f1, args3), MakeCall(f1, args1)));
  EXPECT_FALSE(Equal(e, MakeCall(factory_.AddFunction("f2", 0), args1)));
  Expr args4[] = {MakeVariable(0), MakeVariable(1), MakeConst(0)};
  EXPECT_FALSE(Equal(e, MakeCall(f1, args4)));
  EXPECT_FALSE(Equal(e, MakeConst(42)));
}